

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastStackArgumentsLdElemI(Lowerer *this,Instr *ldElem)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  Opnd *pOVar4;
  IndirOpnd *pIVar5;
  RegOpnd *indexOpnd_00;
  undefined4 *puVar6;
  IndirOpnd *argIndirOpnd;
  RegOpnd *indexOpnd;
  IndirOpnd *indirOpnd;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  pOVar4 = IR::Instr::GetSrc1(ldElem);
  pIVar5 = IR::Opnd::AsIndirOpnd(pOVar4);
  indexOpnd_00 = IR::IndirOpnd::GetIndexOpnd(pIVar5);
  if (indexOpnd_00 != (RegOpnd *)0x0) {
    bVar2 = IR::Opnd::IsTaggedInt(&indexOpnd_00->super_Opnd);
    if (bVar2) goto LAB_007e2ba9;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x5623,"(indexOpnd && indexOpnd->IsTaggedInt())",
                     "indexOpnd && indexOpnd->IsTaggedInt()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_007e2ba9:
  bVar2 = Func::IsInlinee(ldElem->m_func);
  if (bVar2) {
    pIVar5 = GetArgsIndirOpndForInlinee(this,ldElem,&indexOpnd_00->super_Opnd);
    pOVar4 = IR::Instr::GetDst(ldElem);
    InsertMove(pOVar4,&pIVar5->super_Opnd,ldElem,true);
  }
  else {
    pOVar4 = IR::Instr::GetDst(ldElem);
    iVar3 = IR::IndirOpnd::GetOffset(pIVar5);
    GenerateLoadStackArgumentByIndex(this,pOVar4,indexOpnd_00,ldElem,iVar3 + 1,this->m_func);
  }
  IR::Instr::Remove(ldElem);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStackArgumentsLdElemI(IR::Instr* ldElem)
{
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    // Now load the index and check if it is an integer.
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    Assert (indexOpnd && indexOpnd->IsTaggedInt());

    if(ldElem->m_func->IsInlinee())
    {
        IR::IndirOpnd *argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, indexOpnd);

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
    }
    else
    {
        GenerateLoadStackArgumentByIndex(ldElem->GetDst(), indexOpnd, ldElem, indirOpnd->GetOffset() + 1, m_func); // +1 to offset 'this'
    }

    ldElem->Remove();
    return false;
}